

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  _Base_ptr p_Var2;
  cmCTest *pcVar3;
  _Base_ptr p_Var4;
  char cVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Rb_tree_color _Var11;
  long lVar12;
  string *label;
  _Base_ptr p_Var13;
  ostringstream cmCTestLog_msg_5;
  ostringstream indexStr;
  cmWorkingDirectory workdir;
  cmCTestRunTest testRun;
  long *local_5f8;
  long local_5f0;
  long local_5e8 [2];
  _Base_ptr local_5d8;
  _Base_ptr local_5d0;
  long *local_5c8 [2];
  long local_5b8 [12];
  ios_base local_558 [264];
  long *local_450 [2];
  long local_440 [12];
  ios_base local_3e0 [264];
  cmWorkingDirectory local_2d8;
  undefined1 local_2b0 [640];
  
  bVar6 = cmCTest::GetOutputAsJson(this->CTest);
  if (bVar6) {
    PrintOutputAsJson(this);
    return;
  }
  pcVar1 = this->TestHandler;
  _Var11 = _S_red;
  for (p_Var7 = (this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 !=
      &(this->PendingTests).
       super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if ((int)_Var11 < (int)p_Var7[1]._M_color) {
      _Var11 = p_Var7[1]._M_color;
    }
  }
  pcVar1->MaxIndex = _Var11;
  p_Var9 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5d8 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_5d8) {
    do {
      p_Var2 = p_Var9[1]._M_parent;
      cmWorkingDirectory::cmWorkingDirectory(&local_2d8,(string *)&p_Var2[2]._M_parent);
      cmCTestRunTest::cmCTestRunTest
                ((cmCTestRunTest *)local_2b0,this,*(int *)&p_Var2[0x10]._M_parent);
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2b0);
      if (p_Var2[0x13]._M_parent != p_Var2[0x13]._M_left) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"Labels:",7);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x57b,(char *)local_5c8[0],this->Quiet);
        if (local_5c8[0] != local_5b8) {
          operator_delete(local_5c8[0],local_5b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
        std::ios_base::~ios_base(local_3e0);
      }
      p_Var4 = p_Var2[0x13]._M_left;
      local_5d0 = p_Var9;
      for (p_Var13 = p_Var2[0x13]._M_parent; p_Var13 != p_Var4; p_Var13 = p_Var13 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_450,*(char **)p_Var13,(long)p_Var13->_M_parent);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x57f,(char *)local_5c8[0],this->Quiet);
        if (local_5c8[0] != local_5b8) {
          operator_delete(local_5c8[0],local_5b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
        std::ios_base::~ios_base(local_3e0);
      }
      if (p_Var2[0x13]._M_parent != p_Var2[0x13]._M_left) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        cVar5 = (char)(ostringstream *)local_450;
        std::ios::widen((char)local_450[0][-3] + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x584,(char *)local_5c8[0],this->Quiet);
        if (local_5c8[0] != local_5b8) {
          operator_delete(local_5c8[0],local_5b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
        std::ios_base::~ios_base(local_3e0);
      }
      if (this->TestHandler->MemCheck == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_450,"  Memory Check",0xe);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x589,(char *)local_5c8[0],this->Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"  Test",6);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x58b,(char *)local_5c8[0],this->Quiet);
      }
      if (local_5c8[0] != local_5b8) {
        operator_delete(local_5c8[0],local_5b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      std::ios_base::~ios_base(local_3e0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450," #",2);
      poVar8 = (ostream *)
               std::ostream::operator<<((ostringstream *)local_450,*(int *)&p_Var2[0x10]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      uVar10 = (ulong)this->TestHandler->MaxIndex;
      lVar12 = 4;
      if (9 < uVar10) {
        do {
          lVar12 = lVar12 + 1;
          bVar6 = 99 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar6);
      }
      *(long *)((long)local_5b8 + local_5c8[0][-3]) = lVar12;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c8,(char *)local_5f8,local_5f0);
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x593,(char *)local_5f8,this->Quiet);
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
      std::ios_base::~ios_base(local_558);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c8,(char *)p_Var2[1]._M_parent,(long)p_Var2[1]._M_left);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x595,(char *)local_5f8,this->Quiet);
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
      std::ios_base::~ios_base(local_558);
      if (*(byte *)((long)&p_Var2[0xd]._M_color + 2) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c8," (Disabled)",0xb);
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x598,(char *)local_5f8,this->Quiet);
        if (local_5f8 != local_5e8) {
          operator_delete(local_5f8,local_5e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
        std::ios_base::~ios_base(local_558);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      cVar5 = (char)(ostringstream *)local_5c8;
      std::ios::widen((char)local_5c8[0][-3] + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x59a,(char *)local_5f8,this->Quiet);
      if (local_5f8 != local_5e8) {
        operator_delete(local_5f8,local_5e8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
      std::ios_base::~ios_base(local_558);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      std::ios_base::~ios_base(local_3e0);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2b0);
      cmWorkingDirectory::~cmWorkingDirectory(&local_2d8);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_5d0);
    } while (p_Var9 != local_5d8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
  std::ios::widen((char)(ostringstream *)local_2b0 +
                  (char)(((cmCTestMultiProcessHandler *)(local_2b0._0_8_ + -0x378))->
                        StartNextTestsOnTimer_).super_uv_handle_ptr_<uv_timer_s>.
                        super_uv_handle_ptr_base_<uv_timer_s>.handle.
                        super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 );
  std::ostream::put((char)local_2b0);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Total Tests: ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x5a0,(char *)local_450[0],this->Quiet);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
  std::ios_base::~ios_base((ios_base *)(local_2b0 + 0x70));
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this, p.Index);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}